

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::favoritesCB(Fl_File_Chooser *this,Fl_Widget *w)

{
  Fl_File_Browser *pFVar1;
  Fl_Preferences *this_00;
  uint uVar2;
  char *pcVar3;
  Fl_File_Icon *d;
  fd_set *pfVar4;
  fd_set *in_RCX;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  Fl_Button *pFVar8;
  fd_set *in_R8;
  timeval *in_R9;
  char name [32];
  char pathname [1024];
  char acStack_458 [32];
  char local_438 [1032];
  
  pFVar1 = this->favList;
  if (w == (Fl_Widget *)0x0) {
    Fl_Browser::clear(&pFVar1->super_Fl_Browser);
    Fl_Browser_::deselect((Fl_Browser_ *)this->favList,0);
    uVar7 = 0;
    do {
      sprintf(acStack_458,"favorite%02d",uVar7);
      Fl_Preferences::get(prefs_,acStack_458,local_438,"",0x400);
      if (local_438[0] == '\0') break;
      pFVar1 = this->favList;
      d = Fl_File_Icon::find(local_438,5);
      Fl_Browser::add(&pFVar1->super_Fl_Browser,local_438,d);
      uVar5 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar5;
    } while (uVar5 != 100);
    Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    Fl_Widget::deactivate((Fl_Widget *)this->favOkButton);
    Fl_Window::hotspot(&this->favWindow->super_Fl_Window,(Fl_Widget *)this->favList,0);
    (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
    return;
  }
  if (pFVar1 == (Fl_File_Browser *)w) {
    iVar6 = Fl_Browser::value(&pFVar1->super_Fl_Browser);
    if (iVar6 == 0) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
      pFVar8 = this->favDownButton;
LAB_0020023c:
      Fl_Widget::deactivate(&pFVar8->super_Fl_Widget);
      return;
    }
    if (iVar6 < 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::activate(&this->favUpButton->super_Fl_Widget);
    }
    Fl_Widget::activate(&this->favDeleteButton->super_Fl_Widget);
    pFVar8 = this->favDownButton;
    if ((this->favList->super_Fl_Browser).lines <= iVar6) goto LAB_0020023c;
    goto LAB_002002f9;
  }
  if (this->favUpButton == (Fl_Button *)w) {
    iVar6 = Fl_Browser::value(&pFVar1->super_Fl_Browser);
    pFVar1 = this->favList;
    pcVar3 = Fl_Browser::text(&pFVar1->super_Fl_Browser,iVar6);
    pfVar4 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,iVar6);
    Fl_Browser::insert(&pFVar1->super_Fl_Browser,iVar6 + -1,pcVar3,pfVar4);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)(iVar6 + 1));
    Fl_Browser::select(&this->favList->super_Fl_Browser,iVar6 + -1,(fd_set *)&DAT_00000001,pfVar4,
                       in_R8,in_R9);
    if (iVar6 == 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    pFVar8 = this->favDownButton;
LAB_002002ed:
    Fl_Widget::activate(&pFVar8->super_Fl_Widget);
  }
  else {
    if (this->favDeleteButton != (Fl_Button *)w) {
      if (this->favDownButton != (Fl_Button *)w) {
        if ((Fl_Widget *)this->favOkButton != w) {
          return;
        }
        if ((pFVar1->super_Fl_Browser).lines < 1) {
          uVar5 = 0;
        }
        else {
          uVar2 = 0xffffffff;
          do {
            uVar5 = uVar2;
            uVar2 = uVar5 + 1;
            sprintf(acStack_458,"favorite%02d",(ulong)uVar2);
            this_00 = prefs_;
            pcVar3 = Fl_Browser::text(&this->favList->super_Fl_Browser,uVar5 + 2);
            Fl_Preferences::set(this_00,acStack_458,pcVar3);
          } while ((int)(uVar5 + 2) < (this->favList->super_Fl_Browser).lines);
          if (0x62 < uVar2) goto LAB_0020038b;
          uVar5 = uVar5 + 2;
        }
        do {
          sprintf(acStack_458,"favorite%02d",(ulong)uVar5);
          Fl_Preferences::get(prefs_,acStack_458,local_438,"",0x400);
          if (local_438[0] == '\0') break;
          Fl_Preferences::set(prefs_,acStack_458,"");
          uVar5 = uVar5 + 1;
        } while (uVar5 != 100);
LAB_0020038b:
        update_favorites(this);
        Fl_Preferences::flush(prefs_);
        (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
        return;
      }
      uVar5 = Fl_Browser::value(&pFVar1->super_Fl_Browser);
      pFVar1 = this->favList;
      pcVar3 = Fl_Browser::text(&pFVar1->super_Fl_Browser,uVar5);
      pfVar4 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,uVar5);
      Fl_Browser::insert(&pFVar1->super_Fl_Browser,uVar5 + 2,pcVar3,pfVar4);
      Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)uVar5);
      Fl_Browser::select(&this->favList->super_Fl_Browser,uVar5 + 1,(fd_set *)&DAT_00000001,pfVar4,
                         in_R8,in_R9);
      if (uVar5 + 1 == (this->favList->super_Fl_Browser).lines) {
        Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
      }
      pFVar8 = this->favUpButton;
      goto LAB_002002ed;
    }
    uVar5 = Fl_Browser::value(&pFVar1->super_Fl_Browser);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)uVar5);
    iVar6 = uVar5 - ((this->favList->super_Fl_Browser).lines < (int)uVar5);
    Fl_Browser::select(&this->favList->super_Fl_Browser,iVar6,(fd_set *)&DAT_00000001,in_RCX,in_R8,
                       in_R9);
    if (iVar6 < (this->favList->super_Fl_Browser).lines) {
      Fl_Widget::activate(&this->favDownButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    }
    pFVar8 = this->favUpButton;
    if (1 < iVar6) goto LAB_002002ed;
    Fl_Widget::deactivate(&pFVar8->super_Fl_Widget);
    if (iVar6 == 0) {
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    }
  }
  pFVar8 = &this->favOkButton->super_Fl_Button;
LAB_002002f9:
  Fl_Widget::activate(&pFVar8->super_Fl_Widget);
  return;
}

Assistant:

void
Fl_File_Chooser::favoritesCB(Fl_Widget *w)
					// I - Widget
{
  int		i;			// Looping var
  char		name[32],		// Preference name
		pathname[1024];		// Directory in list


  if (!w) {
    // Load the favorites list...
    favList->clear();
    favList->deselect();

    for (i = 0; i < 100; i ++) {
      // Get favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      // Stop on the first empty favorite...
      if (!pathname[0]) break;

      // Add the favorite to the list...
      favList->add(pathname,
                   Fl_File_Icon::find(pathname, Fl_File_Icon::DIRECTORY));
    }

    favUpButton->deactivate();
    favDeleteButton->deactivate();
    favDownButton->deactivate();
    favOkButton->deactivate();

    favWindow->hotspot(favList);
    favWindow->show();
  } else if (w == favList) {
    i = favList->value();
    if (i) {
      if (i > 1) favUpButton->activate();
      else favUpButton->deactivate();

      favDeleteButton->activate();

      if (i < favList->size()) favDownButton->activate();
      else favDownButton->deactivate();
    } else {
      favUpButton->deactivate();
      favDeleteButton->deactivate();
      favDownButton->deactivate();
    }
  } else if (w == favUpButton) {
    i = favList->value();

    favList->insert(i - 1, favList->text(i), favList->data(i));
    favList->remove(i + 1);
    favList->select(i - 1);

    if (i == 2) favUpButton->deactivate();

    favDownButton->activate();

    favOkButton->activate();
  } else if (w == favDeleteButton) {
    i = favList->value();

    favList->remove(i);

    if (i > favList->size()) i --;
    favList->select(i);

    if (i < favList->size()) favDownButton->activate();
    else favDownButton->deactivate();

    if (i > 1) favUpButton->activate();
    else favUpButton->deactivate();

    if (!i) favDeleteButton->deactivate();

    favOkButton->activate();
  } else if (w == favDownButton) {
    i = favList->value();

    favList->insert(i + 2, favList->text(i), favList->data(i));
    favList->remove(i);
    favList->select(i + 1);

    if ((i + 1) == favList->size()) favDownButton->deactivate();

    favUpButton->activate();

    favOkButton->activate();
  } else if (w == favOkButton) {
    // Copy the new list over...
    for (i = 0; i < favList->size(); i ++) {
      // Set favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->set(name, favList->text(i + 1));
    }

    // Clear old entries as necessary...
    for (; i < 100; i ++) {
      // Clear favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      if (pathname[0]) prefs_->set(name, "");
      else break;
    }

    update_favorites();
    prefs_->flush();

    favWindow->hide();
  }
}